

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayerStrategy.cpp
# Opt level: O2

void __thiscall
CheaterBotStrategy::CheaterBotStrategy(CheaterBotStrategy *this,CheaterBotStrategy *toCopy)

{
  int *piVar1;
  Country *pCVar2;
  string *this_00;
  allocator<char> local_19;
  
  PlayerStrategy::PlayerStrategy(&this->super_PlayerStrategy,&toCopy->super_PlayerStrategy);
  (this->super_PlayerStrategy)._vptr_PlayerStrategy = (_func_int **)&PTR_yesOrNo_0013a9b8;
  piVar1 = (toCopy->super_PlayerStrategy).exchangingCardType;
  (this->super_PlayerStrategy).armiesToPlace = (toCopy->super_PlayerStrategy).armiesToPlace;
  (this->super_PlayerStrategy).exchangingCardType = piVar1;
  pCVar2 = (toCopy->super_PlayerStrategy).from;
  (this->super_PlayerStrategy).player = (toCopy->super_PlayerStrategy).player;
  (this->super_PlayerStrategy).from = pCVar2;
  (this->super_PlayerStrategy).to = (toCopy->super_PlayerStrategy).to;
  this_00 = (string *)operator_new(0x20);
  std::__cxx11::string::string<std::allocator<char>>((string *)this_00,"CHEATER",&local_19);
  (this->super_PlayerStrategy).strategyName = this_00;
  return;
}

Assistant:

CheaterBotStrategy::CheaterBotStrategy(const CheaterBotStrategy& toCopy) : PlayerStrategy(toCopy) {
    this->exchangingCardType = toCopy.exchangingCardType;
    this->armiesToPlace = toCopy.armiesToPlace;
    this->player = toCopy.player;
    this->from = toCopy.from;
    this->to = toCopy.to;
    this->strategyName = new std::string("CHEATER");
}